

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

void search_wiener(RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
                  RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  int16_t *piVar1;
  short *psVar2;
  short sVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int16_t iVar10;
  short sVar11;
  uint wiener_win;
  uint stride;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  WienerInfo *wiener_info;
  uint64_t uVar17;
  _func_void_int_uint8_t_ptr_uint8_t_ptr_int16_t_ptr_int16_t_ptr_int_int_int_int_int_int_int64_t_ptr_int64_t_ptr_aom_bit_depth_t
  **pp_Var18;
  long lVar19;
  long lVar20;
  long lVar21;
  RestorationUnitInfo *pRVar22;
  byte bVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long *plVar29;
  int64_t **ppiVar30;
  long lVar31;
  int s;
  uint uVar32;
  ulong uVar33;
  int64_t *piVar34;
  int iVar35;
  int iVar36;
  int64_t *piVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  int iVar41;
  ulong uVar42;
  int64_t iVar43;
  uint uVar44;
  int p;
  int iVar45;
  bool bVar46;
  int iVar47;
  ulong uVar48;
  aom_bit_depth_t aVar49;
  RestorationUnitInfo rui;
  int64_t A [4];
  int64_t S [7];
  int32_t hfilter [7];
  int32_t vfilter [7];
  undefined8 uStack_4ed8;
  int32_t b2 [7];
  int32_t b1 [7];
  int64_t *Hc [49];
  int64_t M [49];
  int64_t H [2401];
  
  lVar4 = *(long *)((long)priv + 0x18);
  lVar19 = *(long *)((long)priv + 0x38);
  uVar24 = (ulong)*(int *)(lVar4 + 0xb93c);
  wiener_info = (WienerInfo *)((long)rest_unit_idx * 0x40 + *(long *)((long)priv + 0x30));
  if (*(int *)(lVar19 + 0x2c) != 0) {
    iVar10 = av1_dc_quant_QTX(*(int *)(*(long *)((long)priv + 0x10) + 0x268),0,
                              *(aom_bit_depth_t *)
                               (*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x48));
    iVar35 = *(int *)(&DAT_0045e608 + (long)*(int *)(*(long *)((long)priv + 0x38) + 0x2c) * 4);
    uVar17 = (*var_part_extractors
               [(ulong)*(byte *)(*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x4c) * 3 +
                (long)*(int *)((long)priv + 0x20)])
                       (*priv,limits->h_start,limits->h_end - limits->h_start,limits->v_start,
                        limits->v_end - limits->v_start);
    lVar19 = *(long *)((long)priv + 0x60);
    if (uVar17 < (ulong)(long)(((int)iVar10 >> 3) * ((int)iVar10 >> 3) * iVar35 >> 4)) {
LAB_001e360b:
      *(long *)((long)priv + 0xa8) = *(long *)((long)priv + 0xa8) + uVar24;
      *(long *)((long)priv + 0x88) = *(long *)((long)priv + 0x88) + lVar19;
      wiener_info[1].vfilter[6] = 0;
      wiener_info[1].vfilter[7] = 0;
      *(undefined8 *)((long)priv + 0x68) = 0x7fffffffffffffff;
      if (*(int *)(*(long *)((long)priv + 0x38) + 0x30) != 2) {
        return;
      }
      *(undefined1 *)((long)priv + 0x78) = 1;
      return;
    }
    if (lVar19 == 0) {
      lVar19 = 0;
      goto LAB_001e360b;
    }
    lVar19 = *(long *)((long)priv + 0x38);
  }
  wiener_win = (uint)(*(int *)((long)priv + 0x20) == 0) * 2 + 5;
  uVar48 = 5;
  if (*(int *)(lVar19 + 0x34) == 0) {
    uVar48 = (ulong)wiener_win;
  }
  lVar20 = *(long *)(*(long *)((long)priv + 0x10) + 0x6088);
  if (*(char *)(lVar20 + 0x4c) == '\0') {
    aVar49 = *(aom_bit_depth_t *)(lVar19 + 0x3c);
    pp_Var18 = (_func_void_int_uint8_t_ptr_uint8_t_ptr_int16_t_ptr_int16_t_ptr_int_int_int_int_int_int_int64_t_ptr_int64_t_ptr_aom_bit_depth_t
                **)&av1_compute_stats;
  }
  else {
    aVar49 = *(aom_bit_depth_t *)(lVar20 + 0x48);
    pp_Var18 = &av1_compute_stats_highbd;
  }
  iVar35 = (int)uVar48;
  (**pp_Var18)(iVar35,*(uint8_t **)((long)priv + 0x40),*(uint8_t **)((long)priv + 0x50),
               *(int16_t **)((long)priv + 0x120),*(int16_t **)((long)priv + 0x128),limits->h_start,
               limits->h_end,limits->v_start,limits->v_end,*(int *)((long)priv + 0x48),
               *(int *)((long)priv + 0x58),M,H,aVar49);
  uVar33 = uVar48 >> 1;
  uVar32 = (uint)uVar33;
  uVar42 = (ulong)(uVar32 ^ 3);
  for (uVar25 = 0; uVar48 != uVar25; uVar25 = uVar25 + 1) {
    iVar16 = *(int *)(wiener_decompose_sep_sym_init_filt + (ulong)((uVar32 ^ 3) << 2) + uVar25 * 4);
    hfilter[uVar25] = iVar16 << 9;
    vfilter[uVar25] = iVar16 << 9;
  }
  uVar44 = iVar35 * iVar35;
  ppiVar30 = Hc;
  piVar34 = H;
  for (uVar25 = 0; uVar25 != uVar48; uVar25 = uVar25 + 1) {
    (&uStack_4ed8)[uVar25] = M + uVar25 * uVar48;
    piVar37 = piVar34;
    for (uVar39 = 0; uVar48 != uVar39; uVar39 = uVar39 + 1) {
      ppiVar30[uVar39] = piVar37;
      piVar37 = (int64_t *)((long)piVar37 + (ulong)(uint)(iVar35 * 8));
    }
    ppiVar30 = (int64_t **)((long)ppiVar30 + (ulong)(uint)(iVar35 * 8));
    piVar34 = (int64_t *)((long)piVar34 + (ulong)(uVar44 * iVar35 * 8));
  }
  stride = uVar32 + 1;
  uVar25 = (ulong)stride;
  uVar39 = (ulong)((uVar32 + 2) * uVar32);
  iVar12 = stride * uVar32;
  uVar26 = (ulong)(uVar32 * 8);
  lVar19 = (ulong)((iVar35 - uVar32) - 2) << 3;
  for (iVar16 = 1; iVar16 != 5; iVar16 = iVar16 + 1) {
    A[0] = 0;
    A[1] = 0;
    A[2] = 0;
    A[3] = 0;
    rui.restoration_type = RESTORE_NONE;
    rui._4_4_ = 0;
    rui._8_8_ = 0;
    rui.wiener_info.vfilter[0] = 0;
    rui.wiener_info.vfilter[1] = 0;
    rui.wiener_info.vfilter[2] = 0;
    rui.wiener_info.vfilter[3] = 0;
    rui.wiener_info.vfilter[4] = 0;
    rui.wiener_info.vfilter[5] = 0;
    rui.wiener_info.vfilter[6] = 0;
    rui.wiener_info.vfilter[7] = 0;
    rui.wiener_info.hfilter[0] = 0;
    rui.wiener_info.hfilter[1] = 0;
    rui.wiener_info.hfilter[2] = 0;
    rui.wiener_info.hfilter[3] = 0;
    rui.wiener_info.hfilter[4] = 0;
    rui.wiener_info.hfilter[5] = 0;
    rui.wiener_info.hfilter[6] = 0;
    rui.wiener_info.hfilter[7] = 0;
    rui.sgrproj_info.ep = 0;
    rui.sgrproj_info.xqd[0] = 0;
    rui.sgrproj_info.xqd[1] = 0;
    rui._60_4_ = 0;
    for (uVar27 = 0; uVar27 != uVar48; uVar27 = uVar27 + 1) {
      lVar20 = (&uStack_4ed8)[uVar27];
      iVar13 = hfilter[uVar27];
      iVar36 = iVar35 + -1;
      for (uVar40 = 0; uVar48 != uVar40; uVar40 = uVar40 + 1) {
        iVar41 = (int)uVar40;
        if (uVar33 < uVar40) {
          iVar41 = iVar36;
        }
        A[iVar41] = A[iVar41] + (*(long *)(lVar20 + uVar40 * 8) * (long)iVar13) / 0x10000;
        iVar36 = iVar36 + -1;
      }
    }
    split_wiener_filter_coefficients(iVar35,hfilter,b1,b2);
    for (uVar27 = 0; uVar27 != uVar48; uVar27 = uVar27 + 1) {
      iVar13 = hfilter[uVar27];
      for (uVar40 = 0; uVar40 != uVar48; uVar40 = uVar40 + 1) {
        piVar34 = Hc[uVar27 + uVar40 * uVar48];
        iVar36 = b1[uVar40];
        iVar41 = b2[uVar40];
        for (uVar28 = 0; uVar28 != uVar48; uVar28 = uVar28 + 1) {
          uVar14 = ~(uint)uVar28 + iVar35;
          if (uVar28 <= uVar33) {
            uVar14 = (uint)uVar28;
          }
          iVar45 = iVar35 + -1;
          for (uVar38 = 0; uVar48 != uVar38; uVar38 = uVar38 + 1) {
            iVar47 = (int)uVar38;
            if (uVar33 < uVar38) {
              iVar47 = iVar45;
            }
            lVar20 = (piVar34[uVar38] * (long)iVar13) / 0x10000;
            lVar31 = (long)(int)(iVar47 * stride + uVar14);
            *(long *)(rui.wiener_info.vfilter + lVar31 * 4 + -8) =
                 lVar20 * iVar36 + *(long *)(rui.wiener_info.vfilter + lVar31 * 4 + -8) +
                 (lVar20 * iVar41) / 0x10000;
            iVar45 = iVar45 + -1;
          }
          piVar34 = (int64_t *)((long)piVar34 + (ulong)(uVar44 * 8));
        }
      }
    }
    lVar20 = *(long *)(rui.wiener_info.vfilter + uVar39 * 4 + -8);
    plVar29 = (long *)((long)rui.wiener_info.vfilter + (uVar26 - 0x10));
    for (uVar27 = 0; uVar33 != uVar27; uVar27 = uVar27 + 1) {
      A[uVar27] = (A[uVar27] - *plVar29) + (lVar20 - A[uVar33]) * 2;
      plVar29 = (long *)((long)plVar29 + uVar26 + 8);
    }
    pRVar22 = &rui;
    for (uVar27 = 0; uVar27 != uVar33; uVar27 = uVar27 + 1) {
      for (uVar40 = 0; uVar33 != uVar40; uVar40 = uVar40 + 1) {
        piVar1 = (pRVar22->wiener_info).vfilter + uVar40 * 4 + -8;
        *(long *)piVar1 =
             *(long *)piVar1 +
             *(long *)(rui.wiener_info.vfilter + (ulong)(iVar12 + uVar32) * 4 + -8) * 4 +
             (*(long *)((long)rui.wiener_info.vfilter +
                       uVar40 * 8 + (ulong)(uint)(iVar12 * 8) + -0x10) +
             *(long *)(rui.wiener_info.vfilter + (uVar27 * uVar25 + uVar33) * 4 + -8)) * -2;
      }
      pRVar22 = (RestorationUnitInfo *)((long)(pRVar22->wiener_info).vfilter + (uVar26 - 8));
    }
    iVar13 = linsolve_wiener(uVar32,(int64_t *)&rui,stride,A,S);
    if (iVar13 != 0) {
      S[uVar33] = 0x10000;
      lVar20 = lVar19;
      for (uVar27 = uVar25; uVar27 < uVar48; uVar27 = uVar27 + 1) {
        lVar31 = *(long *)((long)S + lVar20);
        S[uVar27] = lVar31;
        S[uVar33] = S[uVar33] + lVar31 * -2;
        lVar20 = lVar20 + -8;
      }
      for (uVar27 = 0; uVar48 != uVar27; uVar27 = uVar27 + 1) {
        lVar20 = S[uVar27];
        if (0x1ffffffe < lVar20) {
          lVar20 = 0x1fffffff;
        }
        if (lVar20 < -0x1fffffff) {
          lVar20 = -0x20000000;
        }
        vfilter[uVar27] = (int32_t)lVar20;
      }
    }
    A[0] = 0;
    A[1] = 0;
    A[2] = 0;
    A[3] = 0;
    rui.restoration_type = RESTORE_NONE;
    rui._4_4_ = 0;
    rui._8_8_ = 0;
    rui.wiener_info.vfilter[0] = 0;
    rui.wiener_info.vfilter[1] = 0;
    rui.wiener_info.vfilter[2] = 0;
    rui.wiener_info.vfilter[3] = 0;
    rui.wiener_info.vfilter[4] = 0;
    rui.wiener_info.vfilter[5] = 0;
    rui.wiener_info.vfilter[6] = 0;
    rui.wiener_info.vfilter[7] = 0;
    rui.wiener_info.hfilter[0] = 0;
    rui.wiener_info.hfilter[1] = 0;
    rui.wiener_info.hfilter[2] = 0;
    rui.wiener_info.hfilter[3] = 0;
    rui.wiener_info.hfilter[4] = 0;
    rui.wiener_info.hfilter[5] = 0;
    rui.wiener_info.hfilter[6] = 0;
    rui.wiener_info.hfilter[7] = 0;
    rui.sgrproj_info.ep = 0;
    rui.sgrproj_info.xqd[0] = 0;
    rui.sgrproj_info.xqd[1] = 0;
    rui._60_4_ = 0;
    for (uVar27 = 0; uVar27 != uVar48; uVar27 = uVar27 + 1) {
      uVar14 = ~(uint)uVar27 + iVar35;
      if (uVar27 <= uVar33) {
        uVar14 = (uint)uVar27;
      }
      iVar43 = A[(int)uVar14];
      for (uVar40 = 0; uVar48 != uVar40; uVar40 = uVar40 + 1) {
        iVar43 = iVar43 + ((long)vfilter[uVar40] * *(long *)((&uStack_4ed8)[uVar27] + uVar40 * 8)) /
                          0x10000;
      }
      A[(int)uVar14] = iVar43;
    }
    split_wiener_filter_coefficients(iVar35,vfilter,b1,b2);
    for (uVar27 = 0; uVar27 != uVar48; uVar27 = uVar27 + 1) {
      uVar14 = ~(uint)uVar27 + iVar35;
      if (uVar27 <= uVar33) {
        uVar14 = (uint)uVar27;
      }
      for (uVar40 = 0; uVar40 != uVar48; uVar40 = uVar40 + 1) {
        uVar15 = ~(uint)uVar40 + iVar35;
        if (uVar40 <= uVar33) {
          uVar15 = (uint)uVar40;
        }
        lVar31 = (long)(int)(uVar15 * stride + uVar14);
        piVar34 = Hc[uVar27 * uVar48 + uVar40];
        lVar20 = *(long *)(rui.wiener_info.vfilter + lVar31 * 4 + -8);
        for (uVar28 = 0; uVar28 != uVar48; uVar28 = uVar28 + 1) {
          for (uVar38 = 0; uVar48 != uVar38; uVar38 = uVar38 + 1) {
            lVar21 = (piVar34[uVar38] * (long)vfilter[uVar28]) / 0x10000;
            lVar20 = b1[uVar38] * lVar21 + lVar20 + (lVar21 * b2[uVar38]) / 0x10000;
          }
          piVar34 = (int64_t *)((long)piVar34 + (ulong)(uVar44 * 8));
        }
        *(long *)(rui.wiener_info.vfilter + lVar31 * 4 + -8) = lVar20;
      }
    }
    lVar20 = *(long *)(rui.wiener_info.vfilter + uVar39 * 4 + -8);
    plVar29 = (long *)((long)rui.wiener_info.vfilter + (uVar26 - 0x10));
    for (uVar27 = 0; uVar33 != uVar27; uVar27 = uVar27 + 1) {
      A[uVar27] = (A[uVar27] - *plVar29) + (lVar20 - A[uVar33]) * 2;
      plVar29 = (long *)((long)plVar29 + uVar26 + 8);
    }
    pRVar22 = &rui;
    for (uVar27 = 0; uVar27 != uVar33; uVar27 = uVar27 + 1) {
      for (uVar40 = 0; uVar33 != uVar40; uVar40 = uVar40 + 1) {
        piVar1 = (pRVar22->wiener_info).vfilter + uVar40 * 4 + -8;
        *(long *)piVar1 =
             *(long *)piVar1 +
             *(long *)(rui.wiener_info.vfilter + (ulong)(iVar12 + uVar32) * 4 + -8) * 4 +
             (*(long *)((long)rui.wiener_info.vfilter +
                       uVar40 * 8 + (ulong)(uint)(iVar12 * 8) + -0x10) +
             *(long *)(rui.wiener_info.vfilter + (uVar27 * uVar25 + uVar33) * 4 + -8)) * -2;
      }
      pRVar22 = (RestorationUnitInfo *)((long)(pRVar22->wiener_info).vfilter + (uVar26 - 8));
    }
    iVar13 = linsolve_wiener(uVar32,(int64_t *)&rui,stride,A,S);
    if (iVar13 != 0) {
      S[uVar33] = 0x10000;
      lVar20 = lVar19;
      for (uVar27 = uVar25; uVar27 < uVar48; uVar27 = uVar27 + 1) {
        lVar31 = *(long *)((long)S + lVar20);
        S[uVar27] = lVar31;
        S[uVar33] = S[uVar33] + lVar31 * -2;
        lVar20 = lVar20 + -8;
      }
      for (uVar27 = 0; uVar48 != uVar27; uVar27 = uVar27 + 1) {
        lVar20 = S[uVar27];
        if (0x1ffffffe < lVar20) {
          lVar20 = 0x1fffffff;
        }
        if (lVar20 < -0x1fffffff) {
          lVar20 = -0x20000000;
        }
        hfilter[uVar27] = (int32_t)lVar20;
      }
    }
  }
  rui._8_8_ = 0;
  rui.sgrproj_info.ep = 0;
  rui.sgrproj_info.xqd[0] = 0;
  rui.sgrproj_info.xqd[1] = 0;
  rui._60_4_ = 0;
  rui.wiener_info.hfilter[0] = 0;
  rui.wiener_info.hfilter[1] = 0;
  rui.wiener_info.hfilter[2] = 0;
  rui.wiener_info.hfilter[3] = 0;
  rui.wiener_info.hfilter[4] = 0;
  rui.wiener_info.hfilter[5] = 0;
  rui.wiener_info.hfilter[6] = 0;
  rui.wiener_info.hfilter[7] = 0;
  rui.wiener_info.vfilter[0] = 0;
  rui.wiener_info.vfilter[1] = 0;
  rui.wiener_info.vfilter[2] = 0;
  rui.wiener_info.vfilter[3] = 0;
  rui.wiener_info.vfilter[4] = 0;
  rui.wiener_info.vfilter[5] = 0;
  rui.wiener_info.vfilter[6] = 0;
  rui.wiener_info.vfilter[7] = 0;
  rui.restoration_type = RESTORE_WIENER;
  rui._4_4_ = 0;
  finalize_sym_filter(iVar35,vfilter,rui.wiener_info.vfilter);
  finalize_sym_filter(iVar35,hfilter,rui.wiener_info.hfilter);
  uStack_4ed8._6_2_ = 0x80;
  S[0]._6_2_ = 0x80;
  lVar19 = 0xc;
  for (lVar20 = 0; lVar20 != 6; lVar20 = lVar20 + 2) {
    sVar3 = *(short *)((long)rui.wiener_info.vfilter + lVar20);
    *(short *)((long)S + lVar19) = sVar3;
    *(short *)((long)S + lVar20) = sVar3;
    sVar11 = *(short *)((long)rui.wiener_info.hfilter + lVar20);
    *(short *)((long)&uStack_4ed8 + lVar19) = sVar11;
    *(short *)((long)&uStack_4ed8 + lVar20) = sVar11;
    S[0]._6_2_ = S[0]._6_2_ + sVar3 * -2;
    uStack_4ed8._6_2_ = uStack_4ed8._6_2_ + sVar11 * -2;
    lVar19 = lVar19 + -2;
  }
  ppiVar30 = Hc;
  memset(ppiVar30,0,0xc4);
  for (uVar33 = 0; uVar33 != uVar48; uVar33 = uVar33 + 1) {
    sVar3 = *(short *)((long)&uStack_4ed8 + (uVar33 + uVar42) * 2);
    for (uVar25 = 0; uVar48 != uVar25; uVar25 = uVar25 + 1) {
      *(int *)((long)ppiVar30 + uVar25 * 4) =
           (int)*(short *)((long)S + uVar25 * 2 + uVar42 * 2) * (int)sVar3;
    }
    ppiVar30 = (int64_t **)((long)ppiVar30 + (ulong)(uint)(iVar35 * 4));
  }
  piVar34 = H;
  lVar19 = 0;
  lVar20 = 0;
  for (uVar48 = 0; uVar48 != uVar44; uVar48 = uVar48 + 1) {
    lVar31 = (long)*(int *)((long)Hc + uVar48 * 4);
    for (uVar33 = 0; uVar44 != uVar33; uVar33 = uVar33 + 1) {
      lVar19 = lVar19 + ((long)*(int *)((long)Hc + uVar33 * 4) * piVar34[uVar33] * lVar31) /
                        0x10000000;
    }
    lVar20 = lVar20 + (M[uVar48] * lVar31) / 0x4000;
    piVar34 = (int64_t *)((long)piVar34 + (ulong)(uVar44 * 8));
  }
  if (0 < (lVar19 - H[(uVar44 + 1) * (uVar44 >> 1)]) + (M[uVar44 >> 1] - lVar20) * 2) {
    *(long *)((long)priv + 0xa8) = *(long *)((long)priv + 0xa8) + uVar24;
    *(long *)((long)priv + 0x88) = *(long *)((long)priv + 0x88) + *(long *)((long)priv + 0x60);
    wiener_info[1].vfilter[6] = 0;
    wiener_info[1].vfilter[7] = 0;
    *(undefined8 *)((long)priv + 0x68) = 0x7fffffffffffffff;
    if (*(int *)(*(long *)((long)priv + 0x38) + 0x30) != 2) {
      return;
    }
    *(undefined1 *)((long)priv + 0x78) = 1;
    return;
  }
  lVar19 = try_restoration_unit((RestSearchCtxt *)priv,limits,&rui);
  if (*(char *)(*(long *)((long)priv + 0x38) + 0x3a) == '\0') {
    uVar32 = 4;
LAB_001e3653:
    if (uVar32 != 0) {
      sVar3 = (short)uVar32;
      sVar11 = sVar3 * 2;
      for (uVar48 = uVar42; uVar33 = uVar42, uVar48 != 3; uVar48 = uVar48 + 1) {
        iVar35 = *(int *)(&DAT_0045e63c + uVar48 * 4);
        lVar31 = 6 - uVar48;
        bVar46 = true;
        lVar20 = lVar19;
        while (iVar16 = (int)rui.wiener_info.hfilter[uVar48] - uVar32, iVar35 <= iVar16) {
          rui.wiener_info.hfilter[uVar48] = (int16_t)iVar16;
          psVar2 = (short *)((long)&rui + lVar31 * 2 + 0x20);
          *psVar2 = *psVar2 - sVar3;
          rui.wiener_info.hfilter[3] = rui.wiener_info.hfilter[3] + sVar11;
          lVar19 = try_restoration_unit((RestSearchCtxt *)priv,limits,&rui);
          if (lVar20 < lVar19) {
            piVar1 = rui.wiener_info.hfilter + uVar48;
            *piVar1 = *piVar1 + sVar3;
            psVar2 = (short *)((long)&rui + lVar31 * 2 + 0x20);
            *psVar2 = *psVar2 + sVar3;
            rui.wiener_info.hfilter[3] = rui.wiener_info.hfilter[3] + sVar3 * -2;
            break;
          }
          bVar46 = false;
          lVar20 = lVar19;
          if (uVar32 != 4) goto LAB_001e376a;
        }
        lVar19 = lVar20;
        if (!bVar46) break;
        iVar35 = *(int *)(&DAT_0045e648 + uVar48 * 4);
        do {
          iVar16 = (int)rui.wiener_info.hfilter[uVar48] + uVar32;
          lVar19 = lVar20;
          if (iVar35 < iVar16) break;
          rui.wiener_info.hfilter[uVar48] = (int16_t)iVar16;
          psVar2 = (short *)((long)&rui + lVar31 * 2 + 0x20);
          *psVar2 = *psVar2 + sVar3;
          rui.wiener_info.hfilter[3] = rui.wiener_info.hfilter[3] + sVar3 * -2;
          lVar19 = try_restoration_unit((RestSearchCtxt *)priv,limits,&rui);
          if (lVar20 < lVar19) {
            piVar1 = rui.wiener_info.hfilter + uVar48;
            *piVar1 = *piVar1 - sVar3;
            psVar2 = (short *)((long)&rui + lVar31 * 2 + 0x20);
            *psVar2 = *psVar2 - sVar3;
            rui.wiener_info.hfilter[3] = rui.wiener_info.hfilter[3] + sVar11;
            lVar19 = lVar20;
            break;
          }
          lVar20 = lVar19;
        } while (uVar32 == 4);
      }
LAB_001e376a:
      do {
        if (uVar33 == 3) goto LAB_001e386c;
        iVar35 = *(int *)(&DAT_0045e63c + uVar33 * 4);
        lVar20 = 6 - uVar33;
        bVar46 = true;
        while (iVar16 = (int)rui.wiener_info.vfilter[uVar33] - uVar32, iVar35 <= iVar16) {
          rui.wiener_info.vfilter[uVar33] = (int16_t)iVar16;
          psVar2 = (short *)((long)&rui + lVar20 * 2 + 0x10);
          *psVar2 = *psVar2 - sVar3;
          rui.wiener_info.vfilter[3] = rui.wiener_info.vfilter[3] + sVar11;
          iVar43 = try_restoration_unit((RestSearchCtxt *)priv,limits,&rui);
          if (lVar19 < iVar43) {
            piVar1 = rui.wiener_info.vfilter + uVar33;
            *piVar1 = *piVar1 + sVar3;
            psVar2 = (short *)((long)&rui + lVar20 * 2 + 0x10);
            *psVar2 = *psVar2 + sVar3;
            rui.wiener_info.vfilter[3] = rui.wiener_info.vfilter[3] + sVar3 * -2;
            break;
          }
          bVar46 = false;
          lVar19 = iVar43;
          if (uVar32 != 4) goto LAB_001e386c;
        }
        if (!bVar46) goto LAB_001e386c;
        iVar35 = *(int *)(&DAT_0045e648 + uVar33 * 4);
        do {
          iVar16 = (int)rui.wiener_info.vfilter[uVar33] + uVar32;
          lVar31 = lVar19;
          if (iVar35 < iVar16) break;
          rui.wiener_info.vfilter[uVar33] = (int16_t)iVar16;
          psVar2 = (short *)((long)&rui + lVar20 * 2 + 0x10);
          *psVar2 = *psVar2 + sVar3;
          rui.wiener_info.vfilter[3] = rui.wiener_info.vfilter[3] + sVar3 * -2;
          lVar31 = try_restoration_unit((RestSearchCtxt *)priv,limits,&rui);
          if (lVar19 < lVar31) {
            piVar1 = rui.wiener_info.vfilter + uVar33;
            *piVar1 = *piVar1 - sVar3;
            psVar2 = (short *)((long)&rui + lVar20 * 2 + 0x10);
            *psVar2 = *psVar2 - sVar3;
            rui.wiener_info.vfilter[3] = rui.wiener_info.vfilter[3] + sVar11;
            lVar31 = lVar19;
            break;
          }
          lVar19 = lVar31;
        } while (uVar32 == 4);
        lVar19 = lVar31;
        uVar33 = uVar33 + 1;
      } while( true );
    }
  }
  *(long *)((long)priv + 0x68) = lVar19;
  *(undefined8 *)wiener_info->hfilter = rui.wiener_info.hfilter._0_8_;
  *(undefined8 *)(wiener_info->hfilter + 4) = rui.wiener_info.hfilter._8_8_;
  *(undefined8 *)wiener_info->vfilter = rui.wiener_info.vfilter._0_8_;
  *(undefined8 *)(wiener_info->vfilter + 4) = rui.wiener_info.vfilter._8_8_;
  iVar35 = *(int *)(lVar4 + 0xb940);
  iVar16 = count_wiener_bits(wiener_win,wiener_info,(WienerInfo *)((long)priv + 0xc0));
  uVar48 = (long)(iVar16 << 9) + (long)iVar35;
  bVar23 = *(char *)(*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x48) * '\x02' - 0x10;
  dVar5 = (double)(*(long *)((long)priv + 0x60) >> (bVar23 & 0x3f)) * 128.0 +
          (double)(int)(uVar24 >> 4) * (double)*(int *)(lVar4 + 0x4218) * 0.001953125;
  dVar6 = (double)(*(long *)((long)priv + 0x68) >> (bVar23 & 0x3f)) * 128.0 +
          (double)(int)(uVar48 >> 4) * (double)*(int *)(lVar4 + 0x4218) * 0.001953125;
  *(uint *)(wiener_info[1].vfilter + 6) = (uint)(dVar6 < dVar5);
  iVar35 = *(int *)(*(long *)((long)priv + 0x38) + 0x30);
  if (iVar35 == 2) {
    bVar46 = dVar5 <= dVar6;
  }
  else {
    if (iVar35 != 1) goto LAB_001e388b;
    bVar46 = dVar5 * 1.01 < dVar6;
  }
  *(bool *)((long)priv + 0x78) = bVar46;
LAB_001e388b:
  if (dVar6 < dVar5) {
    uVar24 = uVar48;
  }
  *(long *)((long)priv + 0x88) =
       *(long *)((long)priv + 0x88) + *(long *)((long)priv + (ulong)(dVar6 < dVar5) * 8 + 0x60);
  *(long *)((long)priv + 0xa8) = *(long *)((long)priv + 0xa8) + uVar24;
  if (dVar6 < dVar5) {
    uVar7 = *(undefined8 *)wiener_info->vfilter;
    uVar8 = *(undefined8 *)(wiener_info->vfilter + 4);
    uVar9 = *(undefined8 *)(wiener_info->hfilter + 4);
    *(undefined8 *)((long)priv + 0xd0) = *(undefined8 *)wiener_info->hfilter;
    *(undefined8 *)((long)priv + 0xd8) = uVar9;
    *(undefined8 *)((WienerInfo *)((long)priv + 0xc0))->vfilter = uVar7;
    *(undefined8 *)((long)priv + 200) = uVar8;
  }
  return;
LAB_001e386c:
  uVar32 = uVar32 >> 1;
  goto LAB_001e3653;
}

Assistant:

static inline void search_wiener(const RestorationTileLimits *limits,
                                 int rest_unit_idx, void *priv, int32_t *tmpbuf,
                                 RestorationLineBuffers *rlbs,
                                 struct aom_internal_error_info *error_info) {
  (void)tmpbuf;
  (void)rlbs;
  (void)error_info;
  RestSearchCtxt *rsc = (RestSearchCtxt *)priv;
  RestUnitSearchInfo *rusi = &rsc->rusi[rest_unit_idx];

  const MACROBLOCK *const x = rsc->x;
  const int64_t bits_none = x->mode_costs.wiener_restore_cost[0];

  // Skip Wiener search for low variance contents
  if (rsc->lpf_sf->prune_wiener_based_on_src_var) {
    const int scale[3] = { 0, 1, 2 };
    // Obtain the normalized Qscale
    const int qs = av1_dc_quant_QTX(rsc->cm->quant_params.base_qindex, 0,
                                    rsc->cm->seq_params->bit_depth) >>
                   3;
    // Derive threshold as sqr(normalized Qscale) * scale / 16,
    const uint64_t thresh =
        (qs * qs * scale[rsc->lpf_sf->prune_wiener_based_on_src_var]) >> 4;
    const int highbd = rsc->cm->seq_params->use_highbitdepth;
    const uint64_t src_var =
        var_restoration_unit(limits, rsc->src, rsc->plane, highbd);
    // Do not perform Wiener search if source variance is lower than threshold
    // or if the reconstruction error is zero
    int prune_wiener = (src_var < thresh) || (rsc->sse[RESTORE_NONE] == 0);
    if (prune_wiener) {
      rsc->total_bits[RESTORE_WIENER] += bits_none;
      rsc->total_sse[RESTORE_WIENER] += rsc->sse[RESTORE_NONE];
      rusi->best_rtype[RESTORE_WIENER - 1] = RESTORE_NONE;
      rsc->sse[RESTORE_WIENER] = INT64_MAX;
      if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) rsc->skip_sgr_eval = 1;
      return;
    }
  }

  const int wiener_win =
      (rsc->plane == AOM_PLANE_Y) ? WIENER_WIN : WIENER_WIN_CHROMA;

  int reduced_wiener_win = wiener_win;
  if (rsc->lpf_sf->reduce_wiener_window_size) {
    reduced_wiener_win =
        (rsc->plane == AOM_PLANE_Y) ? WIENER_WIN_REDUCED : WIENER_WIN_CHROMA;
  }

  int64_t M[WIENER_WIN2];
  int64_t H[WIENER_WIN2 * WIENER_WIN2];
  int32_t vfilter[WIENER_WIN], hfilter[WIENER_WIN];

#if CONFIG_AV1_HIGHBITDEPTH
  const AV1_COMMON *const cm = rsc->cm;
  if (cm->seq_params->use_highbitdepth) {
    // TODO(any) : Add support for use_downsampled_wiener_stats SF in HBD
    // functions. Optimize intrinsics of HBD design similar to LBD (i.e.,
    // pre-calculate d and s buffers and avoid most of the C operations).
    av1_compute_stats_highbd(reduced_wiener_win, rsc->dgd_buffer,
                             rsc->src_buffer, rsc->dgd_avg, rsc->src_avg,
                             limits->h_start, limits->h_end, limits->v_start,
                             limits->v_end, rsc->dgd_stride, rsc->src_stride, M,
                             H, cm->seq_params->bit_depth);
  } else {
    av1_compute_stats(reduced_wiener_win, rsc->dgd_buffer, rsc->src_buffer,
                      rsc->dgd_avg, rsc->src_avg, limits->h_start,
                      limits->h_end, limits->v_start, limits->v_end,
                      rsc->dgd_stride, rsc->src_stride, M, H,
                      rsc->lpf_sf->use_downsampled_wiener_stats);
  }
#else
  av1_compute_stats(reduced_wiener_win, rsc->dgd_buffer, rsc->src_buffer,
                    rsc->dgd_avg, rsc->src_avg, limits->h_start, limits->h_end,
                    limits->v_start, limits->v_end, rsc->dgd_stride,
                    rsc->src_stride, M, H,
                    rsc->lpf_sf->use_downsampled_wiener_stats);
#endif

  wiener_decompose_sep_sym(reduced_wiener_win, M, H, vfilter, hfilter);

  RestorationUnitInfo rui;
  memset(&rui, 0, sizeof(rui));
  rui.restoration_type = RESTORE_WIENER;
  finalize_sym_filter(reduced_wiener_win, vfilter, rui.wiener_info.vfilter);
  finalize_sym_filter(reduced_wiener_win, hfilter, rui.wiener_info.hfilter);

  // Filter score computes the value of the function x'*A*x - x'*b for the
  // learned filter and compares it against identity filer. If there is no
  // reduction in the function, the filter is reverted back to identity
  if (compute_score(reduced_wiener_win, M, H, rui.wiener_info.vfilter,
                    rui.wiener_info.hfilter) > 0) {
    rsc->total_bits[RESTORE_WIENER] += bits_none;
    rsc->total_sse[RESTORE_WIENER] += rsc->sse[RESTORE_NONE];
    rusi->best_rtype[RESTORE_WIENER - 1] = RESTORE_NONE;
    rsc->sse[RESTORE_WIENER] = INT64_MAX;
    if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) rsc->skip_sgr_eval = 1;
    return;
  }

  rsc->sse[RESTORE_WIENER] =
      finer_search_wiener(rsc, limits, &rui, reduced_wiener_win);
  rusi->wiener = rui.wiener_info;

  if (reduced_wiener_win != WIENER_WIN) {
    assert(rui.wiener_info.vfilter[0] == 0 &&
           rui.wiener_info.vfilter[WIENER_WIN - 1] == 0);
    assert(rui.wiener_info.hfilter[0] == 0 &&
           rui.wiener_info.hfilter[WIENER_WIN - 1] == 0);
  }

  const int64_t bits_wiener =
      x->mode_costs.wiener_restore_cost[1] +
      (count_wiener_bits(wiener_win, &rusi->wiener, &rsc->ref_wiener)
       << AV1_PROB_COST_SHIFT);

  double cost_none = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_none >> 4, rsc->sse[RESTORE_NONE],
      rsc->cm->seq_params->bit_depth);
  double cost_wiener = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_wiener >> 4, rsc->sse[RESTORE_WIENER],
      rsc->cm->seq_params->bit_depth);

  RestorationType rtype =
      (cost_wiener < cost_none) ? RESTORE_WIENER : RESTORE_NONE;
  rusi->best_rtype[RESTORE_WIENER - 1] = rtype;

  // Set 'skip_sgr_eval' based on rdcost ratio of RESTORE_WIENER and
  // RESTORE_NONE or based on best_rtype
  if (rsc->lpf_sf->prune_sgr_based_on_wiener == 1) {
    rsc->skip_sgr_eval = cost_wiener > (1.01 * cost_none);
  } else if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) {
    rsc->skip_sgr_eval = rusi->best_rtype[RESTORE_WIENER - 1] == RESTORE_NONE;
  }

#if DEBUG_LR_COSTING
  // Store ref params for later checking
  lr_ref_params[RESTORE_WIENER][rsc->plane][rest_unit_idx].wiener_info =
      rsc->ref_wiener;
#endif  // DEBUG_LR_COSTING

  rsc->total_sse[RESTORE_WIENER] += rsc->sse[rtype];
  rsc->total_bits[RESTORE_WIENER] +=
      (cost_wiener < cost_none) ? bits_wiener : bits_none;
  if (cost_wiener < cost_none) rsc->ref_wiener = rusi->wiener;
}